

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WindowAttach(Parse *pParse,Expr *p,Window *pWin)

{
  Window *pWin_local;
  Expr *p_local;
  Parse *pParse_local;
  
  if (p == (Expr *)0x0) {
    sqlite3WindowDelete(pParse->db,pWin);
  }
  else {
    (p->y).pWin = pWin;
    p->flags = p->flags | 0x1000000;
    pWin->pOwner = p;
    if (((p->flags & 4) != 0) && (pWin->eFrmType != 0xa6)) {
      sqlite3ErrorMsg(pParse,"DISTINCT is not supported for window functions");
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowAttach(Parse *pParse, Expr *p, Window *pWin){
  if( p ){
    assert( p->op==TK_FUNCTION );
    assert( pWin );
    p->y.pWin = pWin;
    ExprSetProperty(p, EP_WinFunc);
    pWin->pOwner = p;
    if( (p->flags & EP_Distinct) && pWin->eFrmType!=TK_FILTER ){
      sqlite3ErrorMsg(pParse,
          "DISTINCT is not supported for window functions"
      );
    }
  }else{
    sqlite3WindowDelete(pParse->db, pWin);
  }
}